

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

LBBox3fa * __thiscall
embree::sse2::PointsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,PointsISA *this,LinearSpace3fa *space,size_t primID,
          BBox1f *time_range)

{
  float *pfVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  size_t *psVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar40;
  undefined1 auVar39 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  float fVar54;
  
  fVar30 = (this->super_Points).super_Geometry.fnumTimeSegments;
  fVar20 = (this->super_Points).super_Geometry.time_range.lower;
  fVar24 = (this->super_Points).super_Geometry.time_range.upper - fVar20;
  fVar29 = (time_range->lower - fVar20) / fVar24;
  fVar24 = (time_range->upper - fVar20) / fVar24;
  fVar20 = fVar30 * fVar29;
  fVar31 = fVar30 * fVar24;
  fVar21 = floorf(fVar20);
  fVar22 = ceilf(fVar31);
  iVar16 = (int)fVar21;
  if (fVar21 <= 0.0) {
    fVar21 = 0.0;
  }
  fVar23 = fVar22;
  if (fVar30 <= fVar22) {
    fVar23 = fVar30;
  }
  iVar14 = -1;
  if (-1 < iVar16) {
    iVar14 = iVar16;
  }
  uVar3 = (int)fVar30 + 1U;
  if ((int)fVar22 < (int)((int)fVar30 + 1U)) {
    uVar3 = (int)fVar22;
  }
  lVar18 = (long)(int)fVar21;
  pBVar2 = (this->super_Points).vertices.items;
  pfVar1 = (float *)(pBVar2[lVar18].super_RawBufferView.ptr_ofs +
                    pBVar2[lVar18].super_RawBufferView.stride * primID);
  fVar22 = *pfVar1;
  fVar33 = pfVar1[1];
  fVar35 = pfVar1[2];
  fVar40 = pfVar1[3];
  fVar4 = (space->vx).field_0.m128[0];
  fVar5 = (space->vx).field_0.m128[1];
  fVar6 = (space->vx).field_0.m128[2];
  fVar7 = (space->vy).field_0.m128[0];
  fVar8 = (space->vy).field_0.m128[1];
  fVar9 = (space->vy).field_0.m128[2];
  fVar10 = (space->vz).field_0.m128[0];
  fVar11 = (space->vz).field_0.m128[1];
  fVar12 = (space->vz).field_0.m128[2];
  fVar32 = fVar22 * fVar4 + fVar33 * fVar7 + fVar35 * fVar10;
  fVar34 = fVar22 * fVar5 + fVar33 * fVar8 + fVar35 * fVar11;
  fVar36 = fVar22 * fVar6 + fVar33 * fVar9 + fVar35 * fVar12;
  fVar22 = (this->super_Points).maxRadiusScale;
  fVar25 = fVar32 - fVar40 * fVar22;
  fVar26 = fVar34 - fVar40 * fVar22;
  fVar27 = fVar36 - fVar40 * fVar22;
  fVar28 = fVar40 - fVar40 * fVar22;
  fVar32 = fVar40 * fVar22 + fVar32;
  fVar34 = fVar40 * fVar22 + fVar34;
  fVar36 = fVar40 * fVar22 + fVar36;
  fVar40 = fVar40 * fVar22 + fVar40;
  lVar19 = (long)(int)fVar23;
  pfVar1 = (float *)(pBVar2[lVar19].super_RawBufferView.ptr_ofs +
                    pBVar2[lVar19].super_RawBufferView.stride * primID);
  fVar33 = *pfVar1;
  fVar35 = pfVar1[1];
  fVar37 = pfVar1[2];
  fVar41 = pfVar1[3];
  fVar42 = fVar33 * fVar4 + fVar35 * fVar7 + fVar37 * fVar10;
  fVar45 = fVar33 * fVar5 + fVar35 * fVar8 + fVar37 * fVar11;
  fVar47 = fVar33 * fVar6 + fVar35 * fVar9 + fVar37 * fVar12;
  fVar33 = fVar42 - fVar41 * fVar22;
  fVar35 = fVar45 - fVar41 * fVar22;
  fVar37 = fVar47 - fVar41 * fVar22;
  fVar38 = fVar41 - fVar41 * fVar22;
  fVar42 = fVar41 * fVar22 + fVar42;
  fVar45 = fVar41 * fVar22 + fVar45;
  fVar47 = fVar41 * fVar22 + fVar47;
  fVar41 = fVar41 * fVar22 + fVar41;
  if (uVar3 - iVar14 == 1) {
    fVar20 = fVar20 - fVar21;
    if (fVar20 <= 0.0) {
      fVar20 = 0.0;
    }
    fVar30 = 1.0 - fVar20;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar30 * fVar25 + fVar20 * fVar33;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar30 * fVar26 + fVar20 * fVar35;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar30 * fVar27 + fVar20 * fVar37;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar30 * fVar28 + fVar20 * fVar38;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar30 * fVar32 + fVar20 * fVar42;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar30 * fVar34 + fVar20 * fVar45;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar30 * fVar36 + fVar20 * fVar47;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar30 * fVar40 + fVar20 * fVar41;
    fVar23 = fVar23 - fVar31;
    if (fVar23 <= 0.0) {
      fVar23 = 0.0;
    }
    fVar30 = 1.0 - fVar23;
    fVar31 = fVar33 * fVar30 + fVar25 * fVar23;
    fVar33 = fVar35 * fVar30 + fVar26 * fVar23;
    fVar35 = fVar37 * fVar30 + fVar27 * fVar23;
    fVar37 = fVar38 * fVar30 + fVar28 * fVar23;
    fVar38 = fVar30 * fVar42 + fVar23 * fVar32;
    fVar42 = fVar30 * fVar45 + fVar23 * fVar34;
    fVar36 = fVar30 * fVar47 + fVar23 * fVar36;
    fVar23 = fVar30 * fVar41 + fVar23 * fVar40;
  }
  else {
    pfVar1 = (float *)(pBVar2[lVar18 + 1].super_RawBufferView.ptr_ofs +
                      pBVar2[lVar18 + 1].super_RawBufferView.stride * primID);
    fVar51 = *pfVar1;
    fVar44 = pfVar1[1];
    fVar53 = pfVar1[2];
    fVar54 = pfVar1[3];
    fVar43 = fVar51 * fVar4 + fVar44 * fVar7 + fVar53 * fVar10;
    fVar46 = fVar51 * fVar5 + fVar44 * fVar8 + fVar53 * fVar11;
    fVar48 = fVar51 * fVar6 + fVar44 * fVar9 + fVar53 * fVar12;
    pfVar1 = (float *)(pBVar2[lVar19 + -1].super_RawBufferView.ptr_ofs +
                      pBVar2[lVar19 + -1].super_RawBufferView.stride * primID);
    fVar51 = *pfVar1;
    fVar44 = pfVar1[1];
    fVar53 = pfVar1[2];
    fVar13 = pfVar1[3];
    fVar49 = fVar51 * fVar4 + fVar44 * fVar7 + fVar53 * fVar10;
    fVar50 = fVar51 * fVar5 + fVar44 * fVar8 + fVar53 * fVar11;
    fVar51 = fVar51 * fVar6 + fVar44 * fVar9 + fVar53 * fVar12;
    fVar20 = fVar20 - fVar21;
    if (fVar20 <= 0.0) {
      fVar20 = 0.0;
    }
    fVar44 = 1.0 - fVar20;
    fVar21 = fVar25 * fVar44 + (fVar43 - fVar54 * fVar22) * fVar20;
    fVar25 = fVar26 * fVar44 + (fVar46 - fVar54 * fVar22) * fVar20;
    fVar26 = fVar27 * fVar44 + (fVar48 - fVar54 * fVar22) * fVar20;
    fVar27 = fVar28 * fVar44 + (fVar54 - fVar54 * fVar22) * fVar20;
    fVar28 = fVar44 * fVar32 + fVar20 * (fVar54 * fVar22 + fVar43);
    fVar32 = fVar44 * fVar34 + fVar20 * (fVar54 * fVar22 + fVar46);
    fVar34 = fVar44 * fVar36 + fVar20 * (fVar54 * fVar22 + fVar48);
    fVar20 = fVar44 * fVar40 + fVar20 * (fVar54 * fVar22 + fVar54);
    fVar23 = fVar23 - fVar31;
    if (fVar23 <= 0.0) {
      fVar23 = 0.0;
    }
    fVar40 = 1.0 - fVar23;
    fVar31 = fVar33 * fVar40 + (fVar49 - fVar13 * fVar22) * fVar23;
    fVar33 = fVar35 * fVar40 + (fVar50 - fVar13 * fVar22) * fVar23;
    fVar35 = fVar37 * fVar40 + (fVar51 - fVar13 * fVar22) * fVar23;
    fVar37 = fVar38 * fVar40 + (fVar13 - fVar13 * fVar22) * fVar23;
    fVar38 = fVar40 * fVar42 + fVar23 * (fVar13 * fVar22 + fVar49);
    fVar42 = fVar40 * fVar45 + fVar23 * (fVar13 * fVar22 + fVar50);
    fVar36 = fVar40 * fVar47 + fVar23 * (fVar13 * fVar22 + fVar51);
    fVar23 = fVar40 * fVar41 + fVar23 * (fVar13 * fVar22 + fVar13);
    uVar15 = iVar14 + 1;
    if ((int)uVar15 < (int)uVar3) {
      psVar17 = &pBVar2[uVar15].super_RawBufferView.stride;
      do {
        fVar51 = ((float)(int)uVar15 / fVar30 - fVar29) / (fVar24 - fVar29);
        fVar44 = 1.0 - fVar51;
        pfVar1 = (float *)(((RawBufferView *)(psVar17 + -2))->ptr_ofs + *psVar17 * primID);
        fVar40 = *pfVar1;
        fVar41 = pfVar1[1];
        fVar45 = pfVar1[2];
        fVar47 = pfVar1[3];
        fVar53 = fVar40 * fVar4 + fVar41 * fVar7 + fVar45 * fVar10;
        fVar54 = fVar40 * fVar5 + fVar41 * fVar8 + fVar45 * fVar11;
        fVar40 = fVar40 * fVar6 + fVar41 * fVar9 + fVar45 * fVar12;
        auVar39._0_4_ = (fVar53 - fVar47 * fVar22) - (fVar21 * fVar44 + fVar31 * fVar51);
        auVar39._4_4_ = (fVar54 - fVar47 * fVar22) - (fVar25 * fVar44 + fVar33 * fVar51);
        auVar39._8_4_ = (fVar40 - fVar47 * fVar22) - (fVar26 * fVar44 + fVar35 * fVar51);
        auVar39._12_4_ = (fVar47 - fVar47 * fVar22) - (fVar27 * fVar44 + fVar37 * fVar51);
        auVar52._0_4_ = (fVar47 * fVar22 + fVar53) - (fVar44 * fVar28 + fVar51 * fVar38);
        auVar52._4_4_ = (fVar47 * fVar22 + fVar54) - (fVar44 * fVar32 + fVar51 * fVar42);
        auVar52._8_4_ = (fVar47 * fVar22 + fVar40) - (fVar44 * fVar34 + fVar51 * fVar36);
        auVar52._12_4_ = (fVar47 * fVar22 + fVar47) - (fVar44 * fVar20 + fVar51 * fVar23);
        auVar39 = minps(auVar39,ZEXT816(0));
        auVar52 = maxps(auVar52,ZEXT816(0));
        fVar21 = fVar21 + auVar39._0_4_;
        fVar25 = fVar25 + auVar39._4_4_;
        fVar26 = fVar26 + auVar39._8_4_;
        fVar27 = fVar27 + auVar39._12_4_;
        fVar31 = auVar39._0_4_ + fVar31;
        fVar33 = auVar39._4_4_ + fVar33;
        fVar35 = auVar39._8_4_ + fVar35;
        fVar37 = auVar39._12_4_ + fVar37;
        fVar28 = fVar28 + auVar52._0_4_;
        fVar32 = fVar32 + auVar52._4_4_;
        fVar34 = fVar34 + auVar52._8_4_;
        fVar20 = fVar20 + auVar52._12_4_;
        fVar38 = auVar52._0_4_ + fVar38;
        fVar42 = auVar52._4_4_ + fVar42;
        fVar36 = auVar52._8_4_ + fVar36;
        fVar23 = auVar52._12_4_ + fVar23;
        uVar15 = uVar15 + 1;
        psVar17 = psVar17 + 7;
      } while (uVar3 != uVar15);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar21;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar25;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar26;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar27;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar28;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar32;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar34;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar20;
  }
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar31;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar33;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar35;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar37;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar38;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar42;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar36;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar23;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const
      {
        return linearBounds(space, primID, time_range);
      }